

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O2

Vec_Int_t * If_ManCollectMappingInt(If_Man_t *p)

{
  byte bVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  uint *puVar3;
  int iVar4;
  ulong uVar5;
  Vec_Ptr_t *p_01;
  int iVar6;
  int i;
  
  If_ManMarkMapping(p);
  p_01 = p->vObjs;
  iVar6 = p_01->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar4 = iVar6;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  i = 0;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar2;
  for (; i < iVar6; i = i + 1) {
    puVar3 = (uint *)Vec_PtrEntry(p_01,i);
    if (((*puVar3 & 0xf) == 4) && (puVar3[3] != 0)) {
      bVar1 = *(byte *)((long)puVar3 + 0x6f);
      Vec_IntPush(p_00,(uint)bVar1);
      for (uVar5 = 0; bVar1 != uVar5; uVar5 = uVar5 + 1) {
        Vec_IntPush(p_00,puVar3[uVar5 + 0x1c]);
      }
      Vec_IntPush(p_00,puVar3[1]);
    }
    p_01 = p->vObjs;
    iVar6 = p_01->nSize;
  }
  return p_00;
}

Assistant:

Vec_Int_t * If_ManCollectMappingInt( If_Man_t * p )
{
    Vec_Int_t * vOrder;
    If_Cut_t * pCutBest;
    If_Obj_t * pObj;
    int i, k, nLeaves, * ppLeaves;
    If_ManMarkMapping( p );
    vOrder = Vec_IntAlloc( If_ManObjNum(p) );
    If_ManForEachObj( p, pObj, i )
        if ( If_ObjIsAnd(pObj) && pObj->nRefs )
        {
            pCutBest = If_ObjCutBest( pObj );
            nLeaves  = If_CutLeaveNum( pCutBest ); 
            ppLeaves = If_CutLeaves( pCutBest );
            // save the number of leaves, the leaves, and finally, the root
            Vec_IntPush( vOrder, nLeaves );
            for ( k = 0; k < nLeaves; k++ )
                Vec_IntPush( vOrder, ppLeaves[k] );
            Vec_IntPush( vOrder, pObj->Id );
        }
    return vOrder;
}